

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  U32 UVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  U32 UVar16;
  uint uVar17;
  
  uVar10 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
  pBVar3 = (ms->window).base;
  iVar8 = (int)pBVar3;
  if (0xe0000000 < (uint)((int)iend - iVar8)) {
    uVar6 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < (params->cParams).strategy) &
                 0x1fU);
    uVar17 = (int)ip - iVar8;
    uVar13 = uVar6 - 1 & uVar17;
    uVar14 = 2;
    if (2 < uVar6) {
      uVar14 = uVar6;
    }
    uVar7 = 0;
    if (uVar13 < 2) {
      uVar7 = uVar14;
    }
    uVar14 = uVar6;
    if (uVar6 <= uVar10) {
      uVar14 = uVar10;
    }
    uVar7 = uVar14 + uVar13 + uVar7;
    if (uVar13 != (uVar6 - 1 & uVar7)) {
      __assert_fail("(curr & cycleMask) == (newCurrent & cycleMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x447,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar17 <= uVar7) {
      __assert_fail("curr > newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x448,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    uVar17 = uVar17 - uVar7;
    if (uVar17 < 0x10000001) {
      __assert_fail("correction > 1<<28",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,1099,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                   );
    }
    (ms->window).base = pBVar3 + uVar17;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar17;
    uVar14 = (ms->window).dictLimit;
    uVar6 = (ms->window).lowLimit;
    uVar12 = uVar17 + 2;
    uVar13 = uVar6 - uVar17;
    if (uVar6 < uVar12) {
      uVar13 = 2;
    }
    uVar6 = uVar14 - uVar17;
    if (uVar14 < uVar12) {
      uVar6 = 2;
    }
    (ms->window).lowLimit = uVar13;
    (ms->window).dictLimit = uVar6;
    if (uVar7 < uVar10) {
      __assert_fail("newCurrent >= maxDist",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45c,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar7 - uVar10 < 2) {
      __assert_fail("newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45d,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar7 < uVar13) {
      __assert_fail("window->lowLimit <= newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45f,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar7 < uVar6) {
      __assert_fail("window->dictLimit <= newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x460,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    pUVar4 = &(ms->window).nbOverflowCorrections;
    *pUVar4 = *pUVar4 + 1;
    if (ws->tableValidEnd < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x222,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if (ws->allocStart < ws->tableValidEnd) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x223,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),uVar17);
    iVar8 = ZSTD_allocateChainTable
                      ((params->cParams).strategy,params->useRowMatchFinder,ms->dedicatedDictSearch)
    ;
    if (iVar8 != 0) {
      uVar10 = (params->cParams).chainLog;
      UVar16 = 1 << ((byte)uVar10 & 0x1f);
      pUVar4 = ms->chainTable;
      if ((params->cParams).strategy == ZSTD_btlazy2) {
        UVar9 = UVar16 + 0xf;
        if (-1 < (int)UVar16) {
          UVar9 = UVar16;
        }
        if (uVar10 < 4) {
          __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xa03,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (uVar10 == 0x1f) {
          __assert_fail("size < (1U<<31)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xa04,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        iVar8 = 0;
        iVar11 = 0;
        do {
          lVar15 = 0;
          do {
            pUVar2 = pUVar4 + iVar8 + lVar15;
            uVar10 = *pUVar2;
            uVar14 = pUVar2[1];
            uVar6 = pUVar2[2];
            uVar13 = pUVar2[3];
            pUVar2 = pUVar4 + iVar8 + lVar15;
            *pUVar2 = (~-(uint)(uVar10 == 1) &
                      ~-(uint)((int)(uVar10 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                      uVar10 - uVar17) + (uint)(uVar10 == 1);
            pUVar2[1] = (~-(uint)(uVar14 == 1) &
                        ~-(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar14 - uVar17) + (uint)(uVar14 == 1);
            pUVar2[2] = (~-(uint)(uVar6 == 1) &
                        ~-(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar6 - uVar17) + (uint)(uVar6 == 1);
            pUVar2[3] = (~-(uint)(uVar13 == 1) &
                        ~-(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar13 - uVar17) + (uint)(uVar13 == 1);
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0x10);
          iVar8 = iVar8 + 0x10;
          iVar11 = iVar11 + 1;
        } while (iVar11 != (int)UVar9 >> 4);
      }
      else {
        ZSTD_reduceTable(pUVar4,UVar16,uVar17);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),uVar17);
    }
    pvVar5 = ws->tableValidEnd;
    if (pvVar5 < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22a,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (ws->allocStart < pvVar5) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22b,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (pvVar5 < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    UVar16 = ms->nextToUpdate - uVar17;
    if (ms->nextToUpdate < uVar17) {
      UVar16 = 0;
    }
    ms->nextToUpdate = UVar16;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}